

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O1

void __thiscall restincurl::Worker::Enqueue(Worker *this,ptr_t *req)

{
  iterator *piVar1;
  _Elt_pointer puVar2;
  int iVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::clog,"Queuing request ",0x10);
  std::ios::widen((char)*(undefined8 *)(std::clog + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_);
  if (iVar3 == 0) {
    PrepareThread(this);
    puVar2 = (this->queue_).
             super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (puVar2 == (this->queue_).
                  super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::
      deque<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::allocator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>
      ::
      _M_push_back_aux<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>
                ((deque<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>,std::allocator<std::unique_ptr<restincurl::Request,std::default_delete<restincurl::Request>>>>
                  *)&this->queue_,req);
    }
    else {
      (puVar2->_M_t).
      super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
      super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
      super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl =
           (req->_M_t).
           super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>.
           _M_t.
           super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
           super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl;
      (req->_M_t).
      super___uniq_ptr_impl<restincurl::Request,_std::default_delete<restincurl::Request>_>._M_t.
      super__Tuple_impl<0UL,_restincurl::Request_*,_std::default_delete<restincurl::Request>_>.
      super__Head_base<0UL,_restincurl::Request_*,_false>._M_head_impl = (Request *)0x0;
      piVar1 = &(this->queue_).
                super__Deque_base<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>,_std::allocator<std::unique_ptr<restincurl::Request,_std::default_delete<restincurl::Request>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    Signaler::Signal(&this->signal_);
    pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void Enqueue(Request::ptr_t req) {
            RESTINCURL_LOG_TRACE("Queuing request ");
            lock_t lock(mutex_);
            PrepareThread();
            queue_.push_back(std::move(req));
            Signal();
        }